

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkgitems.cpp
# Opt level: O0

void __thiscall icu_63::NativeItem::setItem(NativeItem *this,Item *item,UDataSwapFn *swap)

{
  char *pcVar1;
  FILE *__stream;
  UBool UVar2;
  UDataInfo *pUVar3;
  UDataSwapper *ds_00;
  char *pcVar4;
  uint8_t *puVar5;
  ulong uVar6;
  UDataSwapper *ds;
  int local_28;
  UErrorCode errorCode;
  int32_t itemHeaderLength;
  int32_t infoLength;
  UDataSwapFn *swap_local;
  Item *item_local;
  NativeItem *this_local;
  
  this->pItem = item;
  ds._4_4_ = U_ZERO_ERROR;
  _itemHeaderLength = swap;
  swap_local = (UDataSwapFn *)item;
  item_local = (Item *)this;
  pUVar3 = ::getDataInfo(this->pItem->data,this->pItem->length,&errorCode,&local_28,
                         (UErrorCode *)((long)&ds + 4));
  this->pInfo = pUVar3;
  UVar2 = ::U_FAILURE(ds._4_4_);
  if (UVar2 != '\0') {
    exit(ds._4_4_);
  }
  this->length = this->pItem->length - local_28;
  if ((this->pInfo->isBigEndian == '\0') && (this->pInfo->charsetFamily == '\0')) {
    this->bytes = this->pItem->data + local_28;
  }
  else {
    ds_00 = udata_openSwapper_63
                      (this->pInfo->isBigEndian,this->pInfo->charsetFamily,'\0','\0',
                       (UErrorCode *)((long)&ds + 4));
    UVar2 = ::U_FAILURE(ds._4_4_);
    __stream = _stderr;
    if (UVar2 != '\0') {
      pcVar1 = this->pItem->name;
      pcVar4 = u_errorName_63(ds._4_4_);
      fprintf(__stream,"icupkg: udata_openSwapper(\"%s\") failed - %s\n",pcVar1,pcVar4);
      exit(ds._4_4_);
    }
    ds_00->printError = printError;
    ds_00->printErrorContext = _stderr;
    uVar6 = (ulong)this->pItem->length;
    if ((long)uVar6 < 0) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (uint8_t *)operator_new__(uVar6);
    this->swapped = puVar5;
    if (this->swapped == (uint8_t *)0x0) {
      fprintf(_stderr,"icupkg: unable to allocate memory for swapping \"%s\"\n",this->pItem->name);
      exit(7);
    }
    (*_itemHeaderLength)
              (ds_00,this->pItem->data,this->pItem->length,this->swapped,
               (UErrorCode *)((long)&ds + 4));
    pUVar3 = ::getDataInfo(this->swapped,this->pItem->length,&errorCode,&local_28,
                           (UErrorCode *)((long)&ds + 4));
    this->pInfo = pUVar3;
    this->bytes = this->swapped + local_28;
    udata_closeSwapper_63(ds_00);
  }
  return;
}

Assistant:

void setItem(const Item *item, UDataSwapFn *swap) {
        pItem=item;
        int32_t infoLength, itemHeaderLength;
        UErrorCode errorCode=U_ZERO_ERROR;
        pInfo=::getDataInfo(pItem->data, pItem->length, infoLength, itemHeaderLength, &errorCode);
        if(U_FAILURE(errorCode)) {
            exit(errorCode); // should succeed because readFile() checks headers
        }
        length=pItem->length-itemHeaderLength;

        if(pInfo->isBigEndian==U_IS_BIG_ENDIAN && pInfo->charsetFamily==U_CHARSET_FAMILY) {
            bytes=pItem->data+itemHeaderLength;
        } else {
            UDataSwapper *ds=udata_openSwapper((UBool)pInfo->isBigEndian, pInfo->charsetFamily, U_IS_BIG_ENDIAN, U_CHARSET_FAMILY, &errorCode);
            if(U_FAILURE(errorCode)) {
                fprintf(stderr, "icupkg: udata_openSwapper(\"%s\") failed - %s\n",
                        pItem->name, u_errorName(errorCode));
                exit(errorCode);
            }

            ds->printError=printError;
            ds->printErrorContext=stderr;

            swapped=new uint8_t[pItem->length];
            if(swapped==NULL) {
                fprintf(stderr, "icupkg: unable to allocate memory for swapping \"%s\"\n", pItem->name);
                exit(U_MEMORY_ALLOCATION_ERROR);
            }
            swap(ds, pItem->data, pItem->length, swapped, &errorCode);
            pInfo=::getDataInfo(swapped, pItem->length, infoLength, itemHeaderLength, &errorCode);
            bytes=swapped+itemHeaderLength;
            udata_closeSwapper(ds);
        }
    }